

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall google::anon_unknown_10::LogFileObject::~LogFileObject(LogFileObject *this)

{
  Mutex *__rwlock;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  MutexLock l;
  MutexLock local_18;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__LogFileObject_00130658;
  __rwlock = &this->lock_;
  local_18.mu_ = __rwlock;
  if ((this->lock_).is_safe_ == true) {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    if (iVar3 != 0) goto LAB_00114157;
  }
  if ((FILE *)this->file_ != (FILE *)0x0) {
    fclose((FILE *)this->file_);
    this->file_ = (FILE *)0x0;
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_18);
  pcVar2 = (this->filename_extension_)._M_dataplus._M_p;
  paVar1 = &(this->filename_extension_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->symlink_basename_)._M_dataplus._M_p;
  paVar1 = &(this->symlink_basename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->base_filename_)._M_dataplus._M_p;
  paVar1 = &(this->base_filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if ((this->lock_).is_safe_ == true) {
    iVar3 = pthread_rwlock_destroy((pthread_rwlock_t *)__rwlock);
    if (iVar3 != 0) {
LAB_00114157:
      abort();
    }
  }
  return;
}

Assistant:

LogFileObject::~LogFileObject() {
  MutexLock l(&lock_);
  if (file_ != NULL) {
    fclose(file_);
    file_ = NULL;
  }
}